

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O2

content<int> * __thiscall mpt::value_store::reserve<int>(value_store *this,long count)

{
  content<int> *pcVar1;
  
  if (((reserve<int>::traits != (type_traits *)0x0) ||
      (reserve<int>::traits = type_properties<int>::traits(),
      reserve<int>::traits != (type_traits *)0x0)) &&
     (pcVar1 = (content<int> *)mpt::value_store::reserve((long)this,(type_traits *)count),
     pcVar1 != (content<int> *)0x0)) {
    this->_type = 0x69;
    return pcVar1;
  }
  return (content<int> *)0x0;
}

Assistant:

content<T> *reserve(long count = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		buffer *buf = reserve(count, *traits);
		if (buf) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<content<T>*>(buf);
	}